

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::runShader
          (TextureSizeCase *this,Surface *dst,IVec3 *size)

{
  code *pcVar1;
  undefined4 uVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  int *piVar7;
  PixelBufferAccess local_1f0;
  MessageBuilder local_1b8;
  undefined4 local_34;
  undefined4 local_30;
  int shaderSizeLoc;
  int shaderSamplerLoc;
  int positionLoc;
  Functions *gl;
  IVec3 *size_local;
  Surface *dst_local;
  TextureSizeCase *this_local;
  
  gl = (Functions *)size;
  size_local = (IVec3 *)dst;
  dst_local = (Surface *)this;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _shaderSamplerLoc = CONCAT44(extraout_var,iVar3);
  pcVar1 = *(code **)(_shaderSamplerLoc + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  shaderSizeLoc = (*pcVar1)(dVar4,"a_position");
  pcVar1 = *(code **)(_shaderSamplerLoc + 0xb48);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  local_30 = (*pcVar1)(dVar4,"u_sampler");
  pcVar1 = *(code **)(_shaderSamplerLoc + 0xb48);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  local_34 = (*pcVar1)(dVar4,"u_size");
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_1b8,(char (*) [33])"Running the verification shader.");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"preclear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1b4);
  (**(code **)(_shaderSamplerLoc + 0x1a00))(0,0,1);
  (**(code **)(_shaderSamplerLoc + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(_shaderSamplerLoc + 0x188))(0x4000);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1b8);
  (**(code **)(_shaderSamplerLoc + 0x40))(0x8892,this->m_vbo);
  (**(code **)(_shaderSamplerLoc + 0x19f0))(shaderSizeLoc,4,0x1406,0,0,0);
  (**(code **)(_shaderSamplerLoc + 0x610))(shaderSizeLoc);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"vertexAttrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1bd);
  pcVar1 = *(code **)(_shaderSamplerLoc + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  (*pcVar1)(dVar4);
  (**(code **)(_shaderSamplerLoc + 0x14f0))(local_30,0);
  uVar2 = local_34;
  if ((this->m_isArrayType & 1U) == 0) {
    pcVar1 = *(code **)(_shaderSamplerLoc + 0x1538);
    piVar7 = tcu::Vector<int,_3>::getPtr((Vector<int,_3> *)gl);
    (*pcVar1)(uVar2,1,piVar7);
  }
  else {
    pcVar1 = *(code **)(_shaderSamplerLoc + 0x1578);
    piVar7 = tcu::Vector<int,_3>::getPtr((Vector<int,_3> *)gl);
    (*pcVar1)(uVar2,1,piVar7);
  }
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1c5);
  pcVar1 = *(code **)(_shaderSamplerLoc + 0xb8);
  GVar5 = getTextureGLTarget(this);
  (*pcVar1)(GVar5,this->m_texture);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"bindtex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1c8);
  (**(code **)(_shaderSamplerLoc + 0x538))(5,0,4);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1cb);
  (**(code **)(_shaderSamplerLoc + 0x518))(shaderSizeLoc);
  (**(code **)(_shaderSamplerLoc + 0x1680))(0);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1cf);
  (**(code **)(_shaderSamplerLoc + 0x648))();
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_1f0,(Surface *)size_local);
  glu::readPixels(pRVar6,0,0,&local_1f0);
  dVar4 = (**(code **)(_shaderSamplerLoc + 0x800))();
  glu::checkError(dVar4,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1d3);
  return;
}

Assistant:

void TextureSizeCase::runShader (tcu::Surface& dst, const tcu::IVec3& size)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const int				positionLoc			= gl.getAttribLocation(m_shader->getProgram(), "a_position");
	const int				shaderSamplerLoc	= gl.getUniformLocation(m_shader->getProgram(), "u_sampler");
	const int				shaderSizeLoc		= gl.getUniformLocation(m_shader->getProgram(), "u_size");

	m_testCtx.getLog() << tcu::TestLog::Message << "Running the verification shader." << tcu::TestLog::EndMessage;

	GLU_EXPECT_NO_ERROR(gl.getError(), "preclear");
	gl.viewport(0, 0, 1, 1);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
	gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(positionLoc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "vertexAttrib");

	gl.useProgram(m_shader->getProgram());
	gl.uniform1i(shaderSamplerLoc, 0);
	if (m_isArrayType)
		gl.uniform3iv(shaderSizeLoc, 1, size.getPtr());
	else
		gl.uniform2iv(shaderSizeLoc, 1, size.getPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup program");

	gl.bindTexture(getTextureGLTarget(), m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindtex");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");

	gl.disableVertexAttribArray(positionLoc);
	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "cleanup");

	gl.finish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "readPixels");
}